

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

bool IsLocalScope(ScopeData *scope)

{
  bool bVar1;
  
  if ((scope == (ScopeData *)0x0) || (scope->type == SCOPE_TEMPORARY)) {
    bVar1 = false;
  }
  else {
    for (; (bVar1 = scope != (ScopeData *)0x0, bVar1 &&
           ((scope->ownerFunction == (FunctionData *)0x0 && (scope->ownerType == (TypeBase *)0x0))))
        ; scope = scope->scope) {
    }
  }
  return bVar1;
}

Assistant:

bool IsLocalScope(ScopeData *scope)
{
	if(!scope)
		return false;

	if(scope->type == SCOPE_TEMPORARY)
		return false;

	// Not a global scope if there is an enclosing function or a type
	while(scope)
	{
		if(scope->ownerFunction || scope->ownerType)
			return true;

		scope = scope->scope;
	}

	return false;
}